

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void xmlSetListDoc(xmlNodePtr list,xmlDocPtr doc)

{
  xmlNodePtr local_20;
  xmlNodePtr cur;
  xmlDocPtr doc_local;
  xmlNodePtr list_local;
  
  if ((list != (xmlNodePtr)0x0) && (local_20 = list, list->type != XML_NAMESPACE_DECL)) {
    for (; local_20 != (xmlNodePtr)0x0; local_20 = local_20->next) {
      if (local_20->doc != doc) {
        xmlSetTreeDoc(local_20,doc);
      }
    }
  }
  return;
}

Assistant:

void
xmlSetListDoc(xmlNodePtr list, xmlDocPtr doc) {
    xmlNodePtr cur;

    if ((list == NULL) || (list->type == XML_NAMESPACE_DECL))
	return;
    cur = list;
    while (cur != NULL) {
	if (cur->doc != doc)
	    xmlSetTreeDoc(cur, doc);
	cur = cur->next;
    }
}